

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

void glob_cleanup(URLGlob *glob)

{
  int local_1c;
  size_t sStack_18;
  int elem;
  size_t i;
  URLGlob *glob_local;
  
  sStack_18 = glob->size;
  while (sStack_18 = sStack_18 - 1, sStack_18 < glob->size) {
    if ((sStack_18 & 1) == 0) {
      if (glob->literal[sStack_18 >> 1] != (char *)0x0) {
        free(glob->literal[sStack_18 >> 1]);
        glob->literal[sStack_18 >> 1] = (char *)0x0;
      }
    }
    else if ((glob->pattern[sStack_18 >> 1].type == UPTSet) &&
            (glob->pattern[sStack_18 >> 1].content.Set.elements != (char **)0x0)) {
      local_1c = (int)glob->pattern[sStack_18 >> 1].content.Set.size;
      while (local_1c = local_1c + -1, -1 < local_1c) {
        if (glob->pattern[sStack_18 >> 1].content.Set.elements[local_1c] != (char *)0x0) {
          free(glob->pattern[sStack_18 >> 1].content.Set.elements[local_1c]);
          glob->pattern[sStack_18 >> 1].content.Set.elements[local_1c] = (char *)0x0;
        }
      }
      if (glob->pattern[sStack_18 >> 1].content.Set.elements != (char **)0x0) {
        free(glob->pattern[sStack_18 >> 1].content.Set.elements);
        glob->pattern[sStack_18 >> 1].content.Set.elements = (char **)0x0;
      }
    }
  }
  if (glob->glob_buffer != (char *)0x0) {
    free(glob->glob_buffer);
    glob->glob_buffer = (char *)0x0;
  }
  if (glob != (URLGlob *)0x0) {
    free(glob);
  }
  return;
}

Assistant:

void glob_cleanup(URLGlob* glob)
{
  size_t i;
  int elem;

  for(i = glob->size - 1; i < glob->size; --i) {
    if(!(i & 1)) {     /* even indexes contain literals */
      Curl_safefree(glob->literal[i/2]);
    }
    else {              /* odd indexes contain sets or ranges */
      if((glob->pattern[i/2].type == UPTSet) &&
         (glob->pattern[i/2].content.Set.elements)) {
        for(elem = glob->pattern[i/2].content.Set.size - 1;
             elem >= 0;
             --elem) {
          Curl_safefree(glob->pattern[i/2].content.Set.elements[elem]);
        }
        Curl_safefree(glob->pattern[i/2].content.Set.elements);
      }
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}